

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall
helics::apps::Connector::establishPotentialInterfaces
          (Connector *this,ConnectionsList *possibleConnections)

{
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *this_00;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *this_01;
  _Rb_tree_header *p_Var1;
  value_t vVar2;
  pointer pbVar3;
  element_type *peVar4;
  _func_int *p_Var5;
  json_value jVar6;
  bool bVar7;
  int logLevel;
  iterator iVar8;
  _Base_ptr p_Var9;
  reference pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uEpt;
  pointer pbVar11;
  string *possibleFed;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_R8;
  Federate *pFVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uInp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uPub;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *this_02;
  string_view target;
  string_view message;
  string_view target_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view target_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view target_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  string_view fmt;
  string_view commandStr;
  format_args args;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  json establishInterfaces;
  data local_a8;
  _Map_pointer local_98;
  string *local_90;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *local_88;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *local_80;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *local_78;
  string *local_70;
  string local_68;
  uint64_t local_48 [3];
  
  scanPotentialInterfaces(this,possibleConnections);
  scanPotentialInterfaceTemplates(this,possibleConnections);
  scanUnconnectedInterfaces(this,possibleConnections);
  pbVar3 = (possibleConnections->unknownInputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &possibleConnections->potentialInputs;
  p_Var1 = &aliasList._M_t._M_impl.super__Rb_tree_header;
  for (pbVar11 = (possibleConnections->unknownInputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar3; pbVar11 = pbVar11 + 1
      ) {
    aliasList._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (pbVar11->_M_dataplus)._M_p;
    aliasList._M_t._M_impl._0_8_ = pbVar11->_M_string_length;
    iVar8 = CLI::std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_00->_M_h,(key_type *)&aliasList);
    if (iVar8.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
        ._M_cur != (__node_type *)0x0) {
      *(undefined1 *)
       ((long)iVar8.
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
              ._M_cur + 0x38) = 1;
    }
    target_00._M_str = (char *)possibleConnections;
    target_00._M_len = (size_t)(pbVar11->_M_dataplus)._M_p;
    generateAliases(&aliasList,(apps *)pbVar11->_M_string_length,target_00,in_R8);
    for (p_Var9 = aliasList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != p_Var1;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
      __y._M_str = (pbVar11->_M_dataplus)._M_p;
      __y._M_len = pbVar11->_M_string_length;
      bVar7 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)(p_Var9 + 1),__y)
      ;
      if (!bVar7) {
        iVar8 = CLI::std::
                _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this_00->_M_h,(key_type *)(p_Var9 + 1));
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
            ._M_cur != (__node_type *)0x0) {
          *(undefined1 *)
           ((long)iVar8.
                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                  ._M_cur + 0x38) = 1;
        }
      }
    }
    CLI::std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&aliasList);
  }
  pbVar3 = (possibleConnections->unknownPubs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = &possibleConnections->potentialPubs;
  for (pbVar11 = (possibleConnections->unknownPubs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar3; pbVar11 = pbVar11 + 1
      ) {
    aliasList._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (pbVar11->_M_dataplus)._M_p;
    aliasList._M_t._M_impl._0_8_ = pbVar11->_M_string_length;
    iVar8 = CLI::std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_01->_M_h,(key_type *)&aliasList);
    if (iVar8.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
        ._M_cur != (__node_type *)0x0) {
      *(undefined1 *)
       ((long)iVar8.
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
              ._M_cur + 0x38) = 1;
    }
    target_01._M_str = (char *)possibleConnections;
    target_01._M_len = (size_t)(pbVar11->_M_dataplus)._M_p;
    generateAliases(&aliasList,(apps *)pbVar11->_M_string_length,target_01,in_R8);
    for (p_Var9 = aliasList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != p_Var1;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
      __y_00._M_str = (pbVar11->_M_dataplus)._M_p;
      __y_00._M_len = pbVar11->_M_string_length;
      bVar7 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)(p_Var9 + 1),
                              __y_00);
      if (!bVar7) {
        iVar8 = CLI::std::
                _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this_01->_M_h,(key_type *)(p_Var9 + 1));
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
            ._M_cur != (__node_type *)0x0) {
          *(undefined1 *)
           ((long)iVar8.
                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                  ._M_cur + 0x38) = 1;
        }
      }
    }
    CLI::std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&aliasList);
  }
  pbVar3 = (possibleConnections->unknownEndpoints).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_02 = &possibleConnections->potentialEndpoints;
  for (pbVar11 = (possibleConnections->unknownEndpoints).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar3; pbVar11 = pbVar11 + 1
      ) {
    aliasList._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (pbVar11->_M_dataplus)._M_p;
    aliasList._M_t._M_impl._0_8_ = pbVar11->_M_string_length;
    iVar8 = CLI::std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_02->_M_h,(key_type *)&aliasList);
    if (iVar8.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
        ._M_cur != (__node_type *)0x0) {
      *(undefined1 *)
       ((long)iVar8.
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
              ._M_cur + 0x38) = 1;
    }
    target_02._M_str = (char *)possibleConnections;
    target_02._M_len = (size_t)(pbVar11->_M_dataplus)._M_p;
    generateAliases(&aliasList,(apps *)pbVar11->_M_string_length,target_02,in_R8);
    for (p_Var9 = aliasList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != p_Var1;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
      __y_01._M_str = (pbVar11->_M_dataplus)._M_p;
      __y_01._M_len = pbVar11->_M_string_length;
      bVar7 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)(p_Var9 + 1),
                              __y_01);
      if (!bVar7) {
        iVar8 = CLI::std::
                _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this_02->_M_h,(key_type *)(p_Var9 + 1));
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
            ._M_cur != (__node_type *)0x0) {
          *(undefined1 *)
           ((long)iVar8.
                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                  ._M_cur + 0x38) = 1;
        }
      }
    }
    CLI::std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree(&aliasList._M_t);
  }
  peVar4 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (peVar4->super_ValueFederate)._vptr_ValueFederate[-3];
  logLevel = (**(code **)(*(long *)((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                                   (long)p_Var5) + 0x48))
                       ((_func_int *)
                        ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate + (long)p_Var5));
  possibleFed = (possibleConnections->federatesWithPotentialInterfaces).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_90 = (possibleConnections->federatesWithPotentialInterfaces).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_98 = (possibleConnections->federatesWithPotentialInterfaces).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_70 = (possibleConnections->federatesWithPotentialInterfaces).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_78 = &possibleConnections->potentialPublicationTemplates;
  local_80 = &possibleConnections->potentialInputTemplates;
  local_88 = this_02;
  while( true ) {
    if (possibleFed == local_70) break;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&establishInterfaces,(nullptr_t)0x0);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<const_char_(&)[20],_char[20],_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_a8,(char (*) [20])"register_interfaces");
    pvVar10 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&establishInterfaces,"command");
    vVar2 = (pvVar10->m_data).m_type;
    (pvVar10->m_data).m_type = local_a8.m_type;
    jVar6 = (pvVar10->m_data).m_value;
    (pvVar10->m_data).m_value = local_a8.m_value;
    local_a8.m_type = vVar2;
    local_a8.m_value = jVar6;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aliasList,"inputs",(allocator<char> *)&local_68);
    peVar4 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar4 == (element_type *)0x0) {
      pFVar12 = (Federate *)0x0;
    }
    else {
      pFVar12 = (Federate *)
                ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    addUsedPotentialInterfaceToCommand
              (&establishInterfaces,this_00,possibleFed,logLevel,(string *)&aliasList,pFVar12);
    std::__cxx11::string::~string((string *)&aliasList);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aliasList,"publications",(allocator<char> *)&local_68);
    peVar4 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar4 == (element_type *)0x0) {
      pFVar12 = (Federate *)0x0;
    }
    else {
      pFVar12 = (Federate *)
                ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    addUsedPotentialInterfaceToCommand
              (&establishInterfaces,this_01,possibleFed,logLevel,(string *)&aliasList,pFVar12);
    std::__cxx11::string::~string((string *)&aliasList);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aliasList,"endpoints",(allocator<char> *)&local_68);
    peVar4 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar4 == (element_type *)0x0) {
      pFVar12 = (Federate *)0x0;
    }
    else {
      pFVar12 = (Federate *)
                ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    addUsedPotentialInterfaceToCommand
              (&establishInterfaces,this_02,possibleFed,logLevel,(string *)&aliasList,pFVar12);
    std::__cxx11::string::~string((string *)&aliasList);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aliasList,"templated_publications",(allocator<char> *)&local_68);
    peVar4 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar4 == (element_type *)0x0) {
      pFVar12 = (Federate *)0x0;
    }
    else {
      pFVar12 = (Federate *)
                ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    addUsedPotentialInterfaceTemplates
              (&establishInterfaces,local_78,possibleFed,logLevel,(string *)&aliasList,pFVar12);
    std::__cxx11::string::~string((string *)&aliasList);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aliasList,"templated_inputs",(allocator<char> *)&local_68);
    peVar4 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar4 == (element_type *)0x0) {
      pFVar12 = (Federate *)0x0;
    }
    else {
      pFVar12 = (Federate *)
                ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    addUsedPotentialInterfaceTemplates
              (&establishInterfaces,local_80,possibleFed,logLevel,(string *)&aliasList,pFVar12);
    std::__cxx11::string::~string((string *)&aliasList);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aliasList,"templated_endpoints",(allocator<char> *)&local_68);
    peVar4 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar4 == (element_type *)0x0) {
      pFVar12 = (Federate *)0x0;
    }
    else {
      pFVar12 = (Federate *)
                ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    addUsedPotentialInterfaceTemplates
              (&establishInterfaces,&possibleConnections->potentialEndpointTemplates,possibleFed,
               logLevel,(string *)&aliasList,pFVar12);
    std::__cxx11::string::~string((string *)&aliasList);
    fileops::generateJsonString((string *)&aliasList,&establishInterfaces,true);
    peVar4 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    aVar13.values_ = (value<fmt::v11::context> *)0x0;
    target._M_str = (possibleFed->_M_dataplus)._M_p;
    target._M_len = possibleFed->_M_string_length;
    commandStr._M_str = (char *)aliasList._M_t._M_impl._0_8_;
    commandStr._M_len = aliasList._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    Federate::sendCommand
              ((Federate *)
               ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
               (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]),target,commandStr,
               HELICS_SEQUENCING_MODE_FAST);
    if (5 < logLevel) {
      peVar4 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var5 = (peVar4->super_ValueFederate)._vptr_ValueFederate[-3];
      local_48[0] = this->interfacesRequested;
      fmt.size_ = 4;
      fmt.data_ = (char *)0x17;
      args.field_1.values_ = aVar13.values_;
      args.desc_ = (unsigned_long_long)local_48;
      ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)"{} interfaces requested",fmt,args);
      message._M_str = local_68._M_dataplus._M_p;
      message._M_len = local_68._M_string_length;
      Federate::logInfoMessage
                ((Federate *)
                 ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate + (long)p_Var5),message);
      std::__cxx11::string::~string((string *)&local_68);
      this_02 = local_88;
    }
    std::__cxx11::string::~string((string *)&aliasList);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&establishInterfaces.m_data);
    possibleFed = possibleFed + 1;
    if (possibleFed == local_90) {
      possibleFed = local_98[1];
      local_98 = local_98 + 1;
      local_90 = possibleFed + 0x10;
    }
  }
  return;
}

Assistant:

void Connector::establishPotentialInterfaces(ConnectionsList& possibleConnections)
{
    scanPotentialInterfaces(possibleConnections);
    scanPotentialInterfaceTemplates(possibleConnections);

    /** now try to match unconnected interfaces to some of the potential ones*/
    scanUnconnectedInterfaces(possibleConnections);
    /** check for unknown interface connections to potential interfaces*/
    scanUnknownInterfaces(possibleConnections);

    const int logLevel = fed->getIntegerProperty(HELICS_PROPERTY_INT_LOG_LEVEL);
    for (auto& possibleFed : possibleConnections.federatesWithPotentialInterfaces) {
        nlohmann::json establishInterfaces;
        establishInterfaces["command"] = "register_interfaces";
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialInputs,
                                           possibleFed,
                                           logLevel,
                                           "inputs",
                                           fed.get());
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialPubs,
                                           possibleFed,
                                           logLevel,
                                           "publications",
                                           fed.get());
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialEndpoints,
                                           possibleFed,
                                           logLevel,
                                           "endpoints",
                                           fed.get());

        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialPublicationTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_publications",
                                           fed.get());
        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialInputTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_inputs",
                                           fed.get());
        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialEndpointTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_endpoints",
                                           fed.get());
        const std::string commandStr = fileops::generateJsonString(establishInterfaces);
        fed->sendCommand(possibleFed, commandStr);
        if (logLevel >= HELICS_LOG_LEVEL_SUMMARY) {
            fed->logInfoMessage(fmt::format("{} interfaces requested", interfacesRequested));
        }
    }
}